

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ObjectivePropagation::getPropagationConstraint
          (ObjectivePropagation *this,HighsInt domchgStackSize,double **vals,HighsInt **inds,
          HighsInt *len,double *rhs,HighsInt domchgCol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsObjectiveFunction *pHVar4;
  HighsInt *pHVar5;
  pointer piVar6;
  pointer piVar7;
  HighsDomain *pHVar8;
  int *piVar9;
  pointer pPVar10;
  pointer ppVar11;
  pointer pdVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  pointer ppVar16;
  int *piVar17;
  double *pdVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  pHVar4 = this->objFunc;
  pHVar5 = (pHVar4->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pHVar4->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar7 = (pHVar4->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *inds = pHVar5;
  pHVar4 = this->objFunc;
  *len = (HighsInt)
         ((ulong)((long)(pHVar4->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar4->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar15 = (int)((ulong)((long)piVar6 - (long)piVar7) >> 2) - 1;
  if (uVar15 == 0) {
    *vals = (pHVar4->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    dVar24 = ((this->domain->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  }
  else {
    pHVar8 = this->domain;
    dVar24 = ((pHVar8->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if ((int)uVar15 < 1) {
      pdVar18 = (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar20 = 0.0;
    }
    else {
      piVar9 = (pHVar4->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar18 = (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar10 = (this->partitionCliqueData).
                super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = 0;
      dVar20 = 0.0;
      dVar22 = dVar24;
      iVar13 = *piVar9;
      do {
        iVar2 = piVar9[uVar19 + 1];
        dVar21 = 0.0;
        if (iVar13 < iVar2) {
          lVar14 = (long)iVar13;
          dVar24 = dVar21;
          do {
            iVar3 = pHVar5[lVar14];
            dVar21 = dVar24;
            if (iVar3 != domchgCol) {
              dVar23 = this->cost[iVar3];
              ppVar11 = (pHVar8->prevboundval_).
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (dVar23 <= 0.0) {
                ppVar16 = (pointer)((pHVar8->col_upper_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + iVar3);
                piVar17 = (pHVar8->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar3;
                while( true ) {
                  iVar3 = *piVar17;
                  if ((iVar3 <= domchgStackSize) &&
                     (((dVar1 = ppVar16->first, iVar3 == -1 || (ppVar11[iVar3].first != dVar1)) ||
                      (NAN(ppVar11[iVar3].first) || NAN(dVar1))))) break;
                  ppVar16 = ppVar11 + iVar3;
                  piVar17 = &ppVar11[iVar3].second;
                }
                if (0.0 < dVar1) {
                  dVar23 = -dVar23;
                  goto LAB_0029217d;
                }
              }
              else {
                ppVar16 = (pointer)((pHVar8->col_lower_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + iVar3);
                piVar17 = (pHVar8->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar3;
                while( true ) {
                  iVar3 = *piVar17;
                  if ((iVar3 <= domchgStackSize) &&
                     (((dVar1 = ppVar16->first, iVar3 == -1 || (ppVar11[iVar3].first != dVar1)) ||
                      (NAN(ppVar11[iVar3].first) || NAN(dVar1))))) break;
                  ppVar16 = ppVar11 + iVar3;
                  piVar17 = &ppVar11[iVar3].second;
                }
                if (dVar1 < 1.0) {
LAB_0029217d:
                  dVar21 = dVar23;
                  if (dVar23 <= dVar24) {
                    dVar21 = dVar24;
                  }
                }
              }
            }
            lVar14 = lVar14 + 1;
            dVar24 = dVar21;
          } while (lVar14 != iVar2);
        }
        iVar3 = pPVar10[uVar19].rhs;
        if (((pPVar10[uVar19].multiplier != dVar21) ||
            (NAN(pPVar10[uVar19].multiplier) || NAN(dVar21))) &&
           (pPVar10[uVar19].multiplier = dVar21, iVar13 < iVar2)) {
          pdVar12 = (pHVar4->objectiveVals).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar14 = (long)iVar13;
          do {
            dVar24 = pdVar12[lVar14];
            pdVar18[lVar14] =
                 dVar24 - (double)((ulong)ABS(dVar21) | (ulong)dVar24 & 0x8000000000000000);
            lVar14 = lVar14 + 1;
          } while (iVar2 != lVar14);
        }
        uVar19 = uVar19 + 1;
        dVar21 = dVar21 * (double)iVar3;
        dVar24 = dVar22 + dVar21;
        dVar20 = dVar20 + (dVar22 - (dVar24 - dVar21)) + (dVar21 - (dVar24 - (dVar24 - dVar21)));
        dVar22 = dVar24;
        iVar13 = iVar2;
      } while (uVar19 != uVar15);
    }
    dVar24 = dVar24 + dVar20;
    *vals = pdVar18;
  }
  *rhs = dVar24;
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::getPropagationConstraint(
    HighsInt domchgStackSize, const double*& vals, const HighsInt*& inds,
    HighsInt& len, double& rhs, HighsInt domchgCol) {
  const HighsInt numPartitions = objFunc->getNumCliquePartitions();
  inds = objFunc->getObjectiveNonzeros().data();
  len = objFunc->getObjectiveNonzeros().size();
  if (numPartitions == 0) {
    vals = objFunc->getObjectiveValuesPacked().data();
    rhs = domain->mipsolver->mipdata_->upper_limit;
    return;
  }
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsCDouble tmpRhs = domain->mipsolver->mipdata_->upper_limit;
  for (HighsInt i = 0; i < numPartitions; ++i) {
    HighsInt start = partitionStarts[i];
    HighsInt end = partitionStarts[i + 1];
    double largest = 0.0;
    for (HighsInt j = start; j < end; ++j) {
      HighsInt c = inds[j];
      HighsInt pos;
      // skip the column we might want to explain a bound change for and take
      // the second largest column instead.
      if (c == domchgCol) continue;
      if (cost[c] > 0) {
        double lb = domain->getColLowerPos(c, domchgStackSize, pos);
        if (lb < 1) largest = std::max(largest, cost[c]);
      } else {
        double ub = domain->getColUpperPos(c, domchgStackSize, pos);
        if (ub > 0) largest = std::max(largest, -cost[c]);
      }
    }

    tmpRhs += largest * partitionCliqueData[i].rhs;
    if (partitionCliqueData[i].multiplier != largest) {
      partitionCliqueData[i].multiplier = largest;
      const auto& packedObjVals = objFunc->getObjectiveValuesPacked();
      for (HighsInt j = start; j < end; ++j)
        propagationConsBuffer[j] =
            packedObjVals[j] - std::copysign(largest, packedObjVals[j]);
    }
  }

  vals = propagationConsBuffer.data();
  rhs = double(tmpRhs);
}